

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemTest.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_286a9::ChecksumOnlyFileSystem_basic_Test::TestBody
          (ChecksumOnlyFileSystem_basic_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> *this_00;
  FileSystem FVar2;
  bool bVar3;
  int iVar4;
  pointer *__ptr;
  SmallVectorImpl<char> *in_R8;
  char *pcVar5;
  char *in_R9;
  bool bVar6;
  StringRef Suffix;
  StringRef Filename;
  StringRef Str;
  AssertionResult gtest_ar_;
  error_code ec;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> missingFileContents;
  unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_> ourFileContents;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> fs;
  FileInfo ourFileInfo;
  FileInfo missingFileInfo;
  SmallString<256U> tempPath;
  undefined1 local_238 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  Child local_228;
  Child local_220;
  undefined1 local_218;
  undefined7 uStack_217;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_208;
  AssertHelper local_200;
  ChecksumOnlyFileSystem local_1f8;
  __uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  local_1e8;
  string local_1e0;
  long local_1c0;
  long local_1b8;
  AssertHelper local_190;
  Child local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_138;
  uint local_130;
  undefined4 uStack_12c;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [256];
  
  llbuild::basic::createLocalFileSystem();
  llbuild::basic::ChecksumOnlyFileSystem::from
            (&local_1f8,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_1e8);
  if (local_1e8._M_t.
      super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
      .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
       )0x0) {
    (**(code **)(*(long *)local_1e8._M_t.
                          super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
                          .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl +
                8))();
  }
  local_1e8._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
  .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl =
       (tuple<llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>)
       (_Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
        )0x0;
  local_130 = 0;
  uStack_12c = 0x100;
  local_138._M_head_impl = local_128;
  llvm::Twine::Twine((Twine *)&local_188,"FileSystemTests");
  Suffix.Length = (size_t)&local_138;
  Suffix.Data = (char *)0x3;
  llvm::sys::fs::createTemporaryFile((fs *)&local_188.character,(Twine *)0x19aa15,Suffix,in_R8);
  local_228.twine = (Twine *)((ulong)(uint)local_228._4_4_ << 0x20);
  local_220.twine = (Twine *)std::_V2::system_category();
  Filename.Length._0_4_ = local_130;
  Filename.Data = (char *)local_138._M_head_impl;
  Filename.Length._4_4_ = 0;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&local_188,Filename,(error_code *)&local_228,F_Text);
  local_238[0] = (internal)(local_228.decUI == 0);
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_228.decUI != 0) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e0,(internal *)local_238,(AssertionResult *)0x19ae70,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xc9,local_1e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
  }
  if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_230,local_230);
  }
  Str.Length = 0xd;
  Str.Data = "Hello, world!";
  iVar4 = 0x19a817;
  llvm::raw_ostream::operator<<((raw_ostream *)&local_188,Str);
  llvm::raw_fd_ostream::close((raw_fd_ostream *)&local_188,iVar4);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_188);
  FVar2._vptr_FileSystem = local_1f8.super_FileSystem._vptr_FileSystem;
  paVar1 = &local_1e0.field_2;
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"/does/not/exists","");
  (**(code **)(*FVar2._vptr_FileSystem + 0x38))(&local_188,FVar2._vptr_FileSystem,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  bVar3 = false;
  bVar6 = false;
  if ((((local_188.twine == (Twine *)0x0) && (bVar6 = bVar3, local_180 == 0)) && (local_178 == 0))
     && ((local_170 == 0 && (local_168 == 0)))) {
    bVar6 = local_160 == 0;
  }
  local_228.character = bVar6;
  local_220.twine = (Twine *)0x0;
  if (bVar6 == false) {
    testing::Message::Message((Message *)local_238);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e0,(internal *)&local_228.character,
               (AssertionResult *)"missingFileInfo.isMissing()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xcf,local_1e0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    if (local_238 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_238 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_220.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_220.twine);
  }
  FVar2._vptr_FileSystem = local_1f8.super_FileSystem._vptr_FileSystem;
  local_228.twine = (Twine *)&local_218;
  if (local_138._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_220.twine = (Twine *)0x0;
    local_218 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,local_138._M_head_impl,local_138._M_head_impl + local_130);
  }
  (**(code **)(*FVar2._vptr_FileSystem + 0x38))(&local_1e0,FVar2._vptr_FileSystem,&local_228);
  if (local_228.twine != (Twine *)&local_218) {
    operator_delete(local_228.twine,CONCAT71(uStack_217,local_218) + 1);
  }
  bVar6 = true;
  if ((((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) && (local_1e0._M_string_length == 0)) &&
     ((local_1e0.field_2._M_allocated_capacity == 0 &&
      ((local_1e0.field_2._8_8_ == 0 && (local_1c0 == 0)))))) {
    bVar6 = local_1b8 != 0;
  }
  local_238[0] = (internal)bVar6;
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar6 == false) {
    testing::Message::Message((Message *)&local_208);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_228,(internal *)local_238,
               (AssertionResult *)"ourFileInfo.isMissing()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd2,local_228.cString);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_228.twine != (Twine *)&local_218) {
      operator_delete(local_228.twine,CONCAT71(uStack_217,local_218) + 1);
    }
    if (local_208._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_208._M_head_impl + 8))();
    }
  }
  if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_230,local_230);
  }
  local_238 = (undefined1  [8])0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long_long>
            ((internal *)&local_228.character,"ourFileInfo.device","0ull",
             (unsigned_long *)&local_1e0,(unsigned_long_long *)local_238);
  if (local_228.character == '\0') {
    testing::Message::Message((Message *)local_238);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220.twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_220.stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_238 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_238 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_220.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_220.twine);
  }
  local_238 = (undefined1  [8])0x0;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long_long>
            ((internal *)&local_228.character,"ourFileInfo.inode","0ull",&local_1e0._M_string_length
             ,(unsigned_long_long *)local_238);
  if (local_228.character == '\0') {
    testing::Message::Message((Message *)local_238);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220.twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_220.stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_208,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_208);
    if (local_238 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_238 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_220.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_220.twine);
  }
  FVar2._vptr_FileSystem = local_1f8.super_FileSystem._vptr_FileSystem;
  local_228.twine = (Twine *)&local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"/does/not/exist","");
  (**(code **)(*FVar2._vptr_FileSystem + 0x20))(&local_208,FVar2._vptr_FileSystem,&local_228);
  if (local_228.twine != (Twine *)&local_218) {
    operator_delete(local_228.twine,CONCAT71(uStack_217,local_218) + 1);
  }
  local_238 = (undefined1  [8])local_208._M_head_impl;
  local_200.data_ = (AssertHelperData *)0x0;
  testing::internal::CmpHelperEQ<llvm::MemoryBuffer*,decltype(nullptr)>
            ((internal *)&local_228.character,"missingFileContents.get()","nullptr",
             (MemoryBuffer **)local_238,&local_200.data_);
  if (local_228.character == '\0') {
    testing::Message::Message((Message *)local_238);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220.twine ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((_Alloc_hider *)&(local_220.stringRef)->Data)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xd8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_200,(Message *)local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    if (local_238 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_238 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220.twine !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_220.character,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_220.twine);
  }
  FVar2._vptr_FileSystem = local_1f8.super_FileSystem._vptr_FileSystem;
  if (local_138._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_220.twine = (Twine *)0x0;
    local_218 = 0;
    local_228.twine = (Twine *)&local_218;
  }
  else {
    local_228.twine = (Twine *)&local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,local_138._M_head_impl,local_138._M_head_impl + local_130);
  }
  (**(code **)(*FVar2._vptr_FileSystem + 0x20))(&local_200,FVar2._vptr_FileSystem,&local_228);
  if (local_228.twine != (Twine *)&local_218) {
    operator_delete(local_228.twine,CONCAT71(uStack_217,local_218) + 1);
  }
  if ((local_200.data_)->file == (char *)0x0) {
    local_220.twine = (Twine *)0x0;
    local_218 = 0;
    local_228.twine = (Twine *)&local_218;
  }
  else {
    local_228.twine = (Twine *)&local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_228,(local_200.data_)->file,*(undefined8 *)&(local_200.data_)->line)
    ;
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[14]>
            ((internal *)local_238,"ourFileContents->getBuffer().str()","\"Hello, world!\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_228,
             (char (*) [14])"Hello, world!");
  if (local_228.twine != (Twine *)&local_218) {
    operator_delete(local_228.twine,CONCAT71(uStack_217,local_218) + 1);
  }
  if (local_238[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_228);
    if (local_230 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_230->_M_dataplus)._M_p;
    }
    this_00 = &local_1f8.impl;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xdb,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)this_00,(Message *)&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    if (local_228.twine != (Twine *)0x0) {
      (**(code **)(*local_228.decUL + 8))();
    }
  }
  if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_230,local_230);
  }
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)local_130;
  local_238 = (undefined1  [8])local_138._M_head_impl;
  llvm::Twine::Twine((Twine *)&local_228,(StringRef *)local_238);
  iVar4 = llvm::sys::fs::remove((fs *)&local_228.character,(char *)0x1);
  local_238[0] = (internal)(iVar4 == 0);
  local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar4 != 0) {
    testing::Message::Message((Message *)&local_1f8.impl);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_228,(internal *)local_238,(AssertionResult *)0x19ae70,"true","false"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Basic/FileSystemTest.cpp"
               ,0xde,local_228.cString);
    testing::internal::AssertHelper::operator=(&local_190,(Message *)&local_1f8.impl);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    if (local_228.twine != (Twine *)&local_218) {
      operator_delete(local_228.twine,CONCAT71(uStack_217,local_218) + 1);
    }
    if (local_1f8.impl._M_t.
        super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
        ._M_t.
        super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
        .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
         )0x0) {
      (*(*(_func_int ***)
          local_1f8.impl._M_t.
          super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
          ._M_t.
          super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
          .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl)[1])();
    }
  }
  if (local_230 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_230,local_230);
  }
  if (local_200.data_ != (AssertHelperData *)0x0) {
    (**(code **)(*(long *)local_200.data_ + 8))();
  }
  if (local_208._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_208._M_head_impl + 8))();
  }
  if (local_138._M_head_impl != local_128) {
    free(local_138._M_head_impl);
  }
  if (local_1f8.super_FileSystem._vptr_FileSystem != (_func_int **)0x0) {
    (**(code **)(*local_1f8.super_FileSystem._vptr_FileSystem + 8))();
  }
  return;
}

Assistant:

TEST(ChecksumOnlyFileSystem, basic) {
  // Check basic sanity of the local filesystem object.
  auto fs = ChecksumOnlyFileSystem::from(createLocalFileSystem());

  // Write a temp file.
  SmallString<256> tempPath;
  llvm::sys::fs::createTemporaryFile("FileSystemTests", "txt", tempPath);
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(tempPath.str(), ec, llvm::sys::fs::F_Text);
    EXPECT_FALSE(ec);
    os << "Hello, world!";
    os.close();
  }

  auto missingFileInfo = fs->getFileInfo("/does/not/exists");
  EXPECT_TRUE(missingFileInfo.isMissing());

  auto ourFileInfo = fs->getFileInfo(tempPath.str());
  EXPECT_FALSE(ourFileInfo.isMissing());

  EXPECT_EQ(ourFileInfo.device, 0ull);
  EXPECT_EQ(ourFileInfo.inode, 0ull);

  auto missingFileContents = fs->getFileContents("/does/not/exist");
  EXPECT_EQ(missingFileContents.get(), nullptr);

  auto ourFileContents = fs->getFileContents(tempPath.str());
  EXPECT_EQ(ourFileContents->getBuffer().str(), "Hello, world!");
  // Remove the temporary file.
  auto ec = llvm::sys::fs::remove(tempPath.str());
  EXPECT_FALSE(ec);
}